

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::ReadBytes(CodedInputStream *input,string *value)

{
  byte *pbVar1;
  pointer __dest;
  bool bVar2;
  uint32 first_byte_or_zero;
  int size;
  ulong uVar3;
  LogMessage *other;
  byte bVar4;
  LogFinisher local_59;
  LogMessage local_58;
  
  pbVar1 = input->buffer_;
  if (pbVar1 < input->buffer_end_) {
    bVar4 = *pbVar1;
    uVar3 = (ulong)bVar4;
    first_byte_or_zero = (uint32)bVar4;
    if (-1 < (char)bVar4) {
      input->buffer_ = pbVar1 + 1;
      bVar4 = 0;
      goto LAB_002caa24;
    }
  }
  else {
    first_byte_or_zero = 0;
  }
  uVar3 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
  bVar4 = (byte)(uVar3 >> 0x3f);
LAB_002caa24:
  size = (int)uVar3;
  if (size < 0 || bVar4 != 0) {
    bVar2 = false;
  }
  else {
    if (*(int *)&input->buffer_end_ - *(int *)&input->buffer_ < size) {
      bVar2 = io::CodedInputStream::ReadStringFallback(input,value,size);
      return bVar2;
    }
    uVar3 = uVar3 & 0xffffffff;
    std::__cxx11::string::resize((ulong)value,(char)uVar3);
    __dest = (value->_M_dataplus)._M_p;
    if (__dest == (pointer)0x0) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream_inl.h"
                 ,0x3c);
      other = LogMessage::operator<<(&local_58,"CHECK failed: z.first != NULL: ");
      LogFinisher::operator=(&local_59,other);
      LogMessage::~LogMessage(&local_58);
    }
    memcpy(__dest,input->buffer_,uVar3);
    input->buffer_ = input->buffer_ + uVar3;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool WireFormatLite::ReadBytes(io::CodedInputStream* input, string* value) {
  return ReadBytesToString(input, value);
}